

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O3

_Bool mon_set_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  short sVar1;
  wchar_t flag_00;
  player_upkeep *ppVar2;
  bool bVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int *piVar6;
  monster_lore *lore;
  int iVar7;
  uint uVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t msg_code;
  
  if (mon == (monster *)0x0) {
    __assert_fail("mon != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8a,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (mon->race == (monster_race *)0x0) {
    __assert_fail("mon->race != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8b,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  if (timer < L'\0') {
    __assert_fail("timer >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-timed.c"
                  ,0x8e,"_Bool mon_set_timed(struct monster *, int, int, int)");
  }
  sVar1 = mon->m_timed[(uint)effect_type];
  wVar9 = (wchar_t)sVar1;
  if (effects[(uint)effect_type].max_timer < timer) {
    timer = effects[(uint)effect_type].max_timer;
  }
  if (timer == wVar9) {
    return false;
  }
  if (timer == L'\0') {
    msg_code = effects[(uint)effect_type].message_end;
    flag = flag | 1;
    if (effect_type == L'\b') {
      (mon->target).midx = L'\0';
    }
  }
  else {
    if (sVar1 == 0) {
      piVar6 = &effects[(uint)effect_type].message_begin;
      flag = flag | 1;
    }
    else {
      if (timer <= wVar9) {
        msg_code = L'\0';
        goto LAB_001786b5;
      }
      piVar6 = &effects[(uint)effect_type].message_increase;
    }
    msg_code = *piVar6;
    lore = get_lore(mon->race);
    if ((flag & 8U) == 0) {
      flag_00 = effects[(uint)effect_type].flag_resist;
      _Var4 = flag_has_dbg(mon->race->flags,0xb,flag_00,"mon->race->flags","effect->flag_resist");
      if (_Var4) {
        lore_learn_flag_if_visible(lore,mon,flag_00);
LAB_0017862b:
        msg_code = L'\b';
        bVar3 = false;
        goto LAB_001786bd;
      }
      if (effects[(uint)effect_type].gets_save == true) {
        iVar7 = 0;
        if (timer < L'2') {
          iVar7 = 0x19 - timer / 2;
        }
        iVar7 = iVar7 + mon->race->level;
        iVar10 = 0x5a;
        if (iVar7 < 0x5a) {
          iVar10 = iVar7;
        }
        _Var4 = monster_is_unique(mon);
        if (((_Var4) && (uVar5 = Rand_div(100), (int)uVar5 < iVar10)) ||
           (uVar5 = Rand_div(100), (int)uVar5 < iVar10)) goto LAB_0017862b;
      }
    }
  }
LAB_001786b5:
  mon->m_timed[(uint)effect_type] = (int16_t)timer;
  bVar3 = true;
LAB_001786bd:
  if (effect_type == L'\t') {
    if (wVar9 < timer) {
      _Var4 = monster_change_shape((monster_conflict *)mon);
      if (!_Var4) {
        mon->m_timed[(uint)effect_type] = sVar1;
        msg_code = L'+';
      }
    }
    else if ((timer == L'\0') && (_Var4 = monster_revert_shape((monster_conflict *)mon), !_Var4)) {
      quit("Monster shapechange reversion failed!");
    }
  }
  if ((((flag & 5U) == 1) && (msg_code != L'\0')) && (_Var4 = monster_is_obvious(mon), _Var4)) {
    add_monster_message((monster_conflict *)mon,msg_code,true);
  }
  if (!bVar3) {
    return false;
  }
  ppVar2 = player->upkeep;
  uVar8 = ppVar2->redraw | 0x200;
  if (ppVar2->health_who != mon) {
    uVar8 = ppVar2->redraw;
  }
  ppVar2->redraw = uVar8 | 0x400000;
  return true;
}

Assistant:

static bool mon_set_timed(struct monster *mon,
		int effect_type,
		int timer,
		int flag)
{
	assert(mon != NULL);
	assert(mon->race != NULL);
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer >= 0);

	struct mon_timed_effect *effect = &effects[effect_type];

	bool check_resist;
	bool resisted = false;
	bool update = false;

	int m_note = 0;
	int old_timer = mon->m_timed[effect_type];

	/* Limit time of effect */
	if (timer > effect->max_timer) {
		timer = effect->max_timer;
	}

	/* No change */
	if (old_timer == timer) {
		return false;
	} else if (timer == 0) {
		/* Turning off, usually mention */
		m_note = effect->message_end;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = false;

		/* When monster command by player (Necromancer power) expires,
		* don't leave stale monster -> monster target */
		if (effect_type == MON_TMD_COMMAND) {
			mon->target.midx = 0;
		}
	} else if (old_timer == 0) {
		/* Turning on, usually mention */
		m_note = effect->message_begin;
		flag |= MON_TMD_FLG_NOTIFY;
		check_resist = true;
	} else if (timer > old_timer) {
		/* Different message for increases, but don't automatically mention. */
		m_note = effect->message_increase;
		check_resist = true;
	} else {
		/* Decreases don't get a message, but never resist them */
		check_resist = false;
	}

	/* Determine if the monster resisted or not, if appropriate */
	if (check_resist && does_resist(mon, effect_type, timer, flag)) {
		resisted = true;
		m_note = MON_MSG_UNAFFECTED;
	} else {
		mon->m_timed[effect_type] = timer;
		update = true;
	}

	/* Special case - deal with monster shapechanges */
	if (effect_type == MON_TMD_CHANGED) {
		if (timer > old_timer) {
			if (!monster_change_shape(mon)) {
				m_note = MON_MSG_SHAPE_FAIL;
				mon->m_timed[effect_type] = old_timer;
			}
		} else if (timer == 0) {
			if (!monster_revert_shape(mon)) {
				quit ("Monster shapechange reversion failed!");
			}
		}
	}

	/* Print a message if there is one, if the effect allows for it, and if
	 * either the monster is visible, or we're trying to ID something */
	if (m_note &&
		!(flag & MON_TMD_FLG_NOMESSAGE) &&
		(flag & MON_TMD_FLG_NOTIFY)
		&& monster_is_obvious(mon)) {
			add_monster_message(mon, m_note, true);
	}

	/* Update the visuals, as appropriate. */
	if (update) {
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
	}

	return !resisted;
}